

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int str_find_aux(lua_State *L,int find)

{
  char *__s1;
  char cVar1;
  StkId pTVar2;
  int iVar3;
  char *pcVar4;
  char *__s;
  lua_Integer lVar5;
  TValue *pTVar6;
  char *pcVar7;
  char *pcVar8;
  size_t __n;
  TValue *i_o;
  long lVar9;
  TValue *pTVar10;
  char *__s_00;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  size_t l2;
  size_t l1;
  MatchState ms;
  ulong local_260;
  ulong local_258;
  MatchState local_250;
  
  pcVar4 = luaL_checklstring(L,1,&local_258);
  __s = luaL_checklstring(L,2,&local_260);
  lVar5 = luaL_optinteger(L,3,1);
  lVar9 = (lVar5 >> 0x3f & local_258 + 1) + lVar5;
  lVar11 = 0;
  if (0 < lVar9) {
    lVar11 = lVar9;
  }
  uVar12 = lVar11 - 1U;
  if (local_258 <= lVar11 - 1U) {
    uVar12 = local_258;
  }
  if (lVar9 < 1) {
    uVar12 = 0;
  }
  if (find != 0) {
    pTVar10 = L->top;
    pTVar6 = &luaO_nilobject_;
    if (L->base + 3 < pTVar10) {
      pTVar6 = L->base + 3;
    }
    if (((pTVar6->tt != 0) && ((pTVar6->tt != 1 || ((pTVar6->value).b != 0)))) ||
       (pcVar7 = strpbrk(__s,"^$*+?.([%-"), pcVar7 == (char *)0x0)) {
      pcVar7 = pcVar4 + uVar12;
      if (local_260 == 0) {
        if (pcVar4 != (char *)0x0) {
LAB_0011375a:
          (pTVar10->value).n = (double)(long)(pcVar7 + (1 - (long)pcVar4));
          pTVar10->tt = 3;
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          pTVar2[1].value.n = (double)(long)(pcVar7 + (local_260 - (long)pcVar4));
          pTVar2[1].tt = 3;
          L->top = L->top + 1;
          return 2;
        }
      }
      else if (local_260 <= local_258 - uVar12) {
        __n = local_260 - 1;
        pcVar8 = (char *)((local_258 - uVar12) - __n);
        if (pcVar8 != (char *)0x0) {
          cVar1 = *__s;
          __s_00 = pcVar7;
          do {
            pcVar7 = (char *)memchr(__s_00,(int)cVar1,(size_t)pcVar8);
            if (pcVar7 == (char *)0x0) break;
            __s1 = pcVar7 + 1;
            iVar3 = bcmp(__s1,__s + 1,__n);
            if (iVar3 == 0) goto LAB_0011375a;
            pcVar8 = __s_00 + ((long)pcVar8 - (long)__s1);
            __s_00 = __s1;
          } while (pcVar8 != (char *)0x0);
        }
      }
      goto LAB_00113710;
    }
  }
  cVar1 = *__s;
  local_250.src_end = pcVar4 + local_258;
  pcVar7 = pcVar4 + uVar12;
  local_250.src_init = pcVar4;
  local_250.L = L;
  do {
    uVar12 = uVar12 + 1;
    local_250.level = 0;
    pcVar8 = match(&local_250,pcVar7,__s + (cVar1 == '^'));
    if (pcVar8 != (char *)0x0) {
      if (find != 0) {
        pTVar2 = L->top;
        (pTVar2->value).n = (double)(long)uVar12;
        pTVar2->tt = 3;
        pTVar2 = L->top;
        L->top = pTVar2 + 1;
        pTVar2[1].value.n = (double)((long)pcVar8 - (long)pcVar4);
        pTVar2[1].tt = 3;
        L->top = L->top + 1;
        iVar3 = push_captures(&local_250,(char *)0x0,(char *)0x0);
        return iVar3 + 2;
      }
      iVar3 = push_captures(&local_250,pcVar7,pcVar8);
      return iVar3;
    }
  } while ((cVar1 != '^') && (bVar13 = pcVar7 < local_250.src_end, pcVar7 = pcVar7 + 1, bVar13));
  pTVar10 = L->top;
LAB_00113710:
  pTVar10->tt = 0;
  L->top = pTVar10 + 1;
  return 1;
}

Assistant:

static int str_find_aux(lua_State*L,int find){
size_t l1,l2;
const char*s=luaL_checklstring(L,1,&l1);
const char*p=luaL_checklstring(L,2,&l2);
ptrdiff_t init=posrelat(luaL_optinteger(L,3,1),l1)-1;
if(init<0)init=0;
else if((size_t)(init)>l1)init=(ptrdiff_t)l1;
if(find&&(lua_toboolean(L,4)||
strpbrk(p,"^$*+?.([%-")==NULL)){
const char*s2=lmemfind(s+init,l1-init,p,l2);
if(s2){
lua_pushinteger(L,s2-s+1);
lua_pushinteger(L,s2-s+l2);
return 2;
}
}
else{
MatchState ms;
int anchor=(*p=='^')?(p++,1):0;
const char*s1=s+init;
ms.L=L;
ms.src_init=s;
ms.src_end=s+l1;
do{
const char*res;
ms.level=0;
if((res=match(&ms,s1,p))!=NULL){
if(find){
lua_pushinteger(L,s1-s+1);
lua_pushinteger(L,res-s);
return push_captures(&ms,NULL,0)+2;
}
else
return push_captures(&ms,s1,res);
}
}while(s1++<ms.src_end&&!anchor);
}
lua_pushnil(L);
return 1;
}